

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O2

int Gia_ManCheckRefinements
              (Gia_Man_t *p,Vec_Str_t *vStatus,Vec_Int_t *vOutputs,Cec_ManSim_t *pSim,int fRings)

{
  char cVar1;
  int iVar2;
  int i;
  int i_00;
  
  iVar2 = vStatus->nSize;
  if (iVar2 * 2 != vOutputs->nSize) {
    __assert_fail("2 * Vec_StrSize(vStatus) == Vec_IntSize(vOutputs)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                  ,0x268,
                  "int Gia_ManCheckRefinements(Gia_Man_t *, Vec_Str_t *, Vec_Int_t *, Cec_ManSim_t *, int)"
                 );
  }
  i = 0;
  i_00 = 1;
  do {
    if (iVar2 <= i) {
      return 1;
    }
    cVar1 = Vec_StrEntry(vStatus,i);
    Vec_IntEntry(vOutputs,i_00 + -1);
    iVar2 = Vec_IntEntry(vOutputs,i_00);
    if (cVar1 == -1) {
      Cec_ManSimClassRemoveOne(pSim,iVar2);
    }
    else if ((cVar1 == '\0') && (iVar2 == 0)) {
      __assert_fail("k",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x3c2,"int Gia_ObjHasSameRepr(Gia_Man_t *, int, int)");
    }
    i = i + 1;
    iVar2 = vStatus->nSize;
    i_00 = i_00 + 2;
  } while( true );
}

Assistant:

int Gia_ManCheckRefinements( Gia_Man_t * p, Vec_Str_t * vStatus, Vec_Int_t * vOutputs, Cec_ManSim_t * pSim, int fRings )
{
    int i, status, iRepr, iObj;
    int Counter = 0;
    assert( 2 * Vec_StrSize(vStatus) == Vec_IntSize(vOutputs) );
    Vec_StrForEachEntry( vStatus, status, i )
    {
        iRepr = Vec_IntEntry( vOutputs, 2*i );
        iObj  = Vec_IntEntry( vOutputs, 2*i+1 );
        if ( status == 1 )
            continue;
        if ( status == 0 )
        {
            if ( Gia_ObjHasSameRepr(p, iRepr, iObj) )
                Counter++;
//            if ( Gia_ObjHasSameRepr(p, iRepr, iObj) )
//                Abc_Print( 1, "Gia_ManCheckRefinements(): Disproved equivalence (%d,%d) is not refined!\n", iRepr, iObj );
//            if ( Gia_ObjHasSameRepr(p, iRepr, iObj) )
//                Cec_ManSimClassRemoveOne( pSim, iObj );
            continue;
        }
        if ( status == -1 )
        {
//            if ( !Gia_ObjFailed( p, iObj ) )
//                Abc_Print( 1, "Gia_ManCheckRefinements(): Failed equivalence is not marked as failed!\n" );
//            Gia_ObjSetFailed( p, iRepr );
//            Gia_ObjSetFailed( p, iObj );        
//            if ( fRings )
//            Cec_ManSimClassRemoveOne( pSim, iRepr );
            Cec_ManSimClassRemoveOne( pSim, iObj );
            continue;
        }
    }
//    if ( Counter )
//    Abc_Print( 1, "Gia_ManCheckRefinements(): Could not refine %d nodes.\n", Counter );
    return 1;
}